

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::rc::TextureCube::sample4(TextureCube *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  CubeFace CVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  Vec2 dFdx0;
  Vec2 coords [4];
  Vec2 dFdy1;
  Vec2 dFdy0;
  Vec2 dFdx1;
  Vec4 *local_c0;
  ulong local_90;
  Vector<float,_2> local_88;
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  _func_int **local_58;
  deUint32 dStack_50;
  int iStack_4c;
  
  if ((this->m_view).m_numLevels < 1) {
    local_68 = 0.0;
  }
  else {
    local_68 = (float)((this->m_view).m_levels[0]->m_size).m_data[0];
  }
  local_c0 = output;
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
    CVar1 = tcu::selectCubeFace(packetTexcoords);
    tcu::projectToFace((CubeFace)&local_88,(Vec3 *)(ulong)CVar1);
    tcu::projectToFace((CubeFace)&local_80,(Vec3 *)(ulong)CVar1);
    tcu::projectToFace((CubeFace)&local_78,(Vec3 *)(ulong)CVar1);
    tcu::projectToFace((CubeFace)&local_70,(Vec3 *)(ulong)CVar1);
    tcu::operator-(&local_80,&local_88);
    tcu::operator-(&local_70,&local_78);
    tcu::operator-(&local_78,&local_88);
    tcu::operator-(&local_70,&local_80);
    puVar2 = (ulong *)&stack0xffffffffffffffc8;
    if (uVar3 < 2) {
      puVar2 = &local_90;
    }
    puVar4 = (ulong *)&stack0xffffffffffffffb8;
    if ((uVar3 & 1) == 0) {
      puVar4 = (ulong *)&stack0xffffffffffffffc0;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *puVar2;
    auVar7._0_8_ = *puVar2 ^ 0x8000000080000000;
    auVar7._8_4_ = 0x80000000;
    auVar7._12_4_ = 0x80000000;
    auVar8 = maxps(auVar7,auVar8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *puVar4;
    auVar9._0_8_ = *puVar4 ^ 0x8000000080000000;
    auVar9._8_4_ = 0x80000000;
    auVar9._12_4_ = 0x80000000;
    auVar10 = maxps(auVar9,auVar10);
    uVar5 = -(uint)(auVar10._0_4_ <= auVar8._0_4_);
    uVar6 = -(uint)(auVar10._4_4_ <= auVar8._4_4_);
    fVar11 = (float)(~uVar5 & (uint)auVar10._0_4_ | (uint)auVar8._0_4_ & uVar5) * local_68;
    fVar12 = (float)(~uVar6 & (uint)auVar10._4_4_ | (uint)auVar8._4_4_ & uVar6) * fStack_64;
    uVar5 = -(uint)(fVar12 <= fVar11);
    fVar11 = deFloatLog2((float)(~uVar5 & (uint)fVar12 | (uint)fVar11 & uVar5));
    sample((TextureCube *)&stack0xffffffffffffffa8,packetTexcoords->m_data[0],
           packetTexcoords->m_data[1],packetTexcoords->m_data[2],fVar11 + lodBias);
    *(_func_int ***)local_c0->m_data = local_58;
    local_c0->m_data[2] = (float)dStack_50;
    local_c0->m_data[3] = (float)iStack_4c;
    local_c0 = local_c0 + 1;
    packetTexcoords = packetTexcoords + 1;
  }
  return;
}

Assistant:

void TextureCube::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float cubeSide = (float)m_view.getSize();

	// Each tex coord might be in a different face.

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::CubeFace face		= tcu::selectCubeFace(packetTexcoords[fragNdx]);
		const tcu::Vec2		coords[4]	=
		{
			tcu::projectToFace(face, packetTexcoords[0]),
			tcu::projectToFace(face, packetTexcoords[1]),
			tcu::projectToFace(face, packetTexcoords[2]),
			tcu::projectToFace(face, packetTexcoords[3]),
		};

		const tcu::Vec2 dFdx0 = coords[1] - coords[0];
		const tcu::Vec2 dFdx1 = coords[3] - coords[2];
		const tcu::Vec2 dFdy0 = coords[2] - coords[0];
		const tcu::Vec2 dFdy1 = coords[3] - coords[1];

		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * cubeSide, mv * cubeSide);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}